

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test9::getMatrixMultiplicationResult
          (GPUShaderFP64Test9 *this,_variable_type *matrix_a_type,
          vector<double,_std::allocator<double>_> *matrix_a_data,_variable_type *matrix_b_type,
          vector<double,_std::allocator<double>_> *matrix_b_data,double *out_result_ptr)

{
  TestError *this_00;
  Matrix<double,_2,_2> *mat;
  Matrix<double,_2,_2> *mat_00;
  Matrix<double,_3,_2> *mat_01;
  Matrix<double,_2,_3> *mat_02;
  Matrix<double,_2,_4> *mat_03;
  Matrix<double,_4,_2> *mat_04;
  Matrix<double,_3,_3> *mat_05;
  Matrix<double,_3,_3> *mat_06;
  Matrix<double,_4,_2> *mat_07;
  Matrix<double,_2,_4> *mat_08;
  Matrix<double,_2,_3> *mat_09;
  Matrix<double,_3,_2> *mat_10;
  Matrix<double,_3,_4> *mat_11;
  Matrix<double,_4,_3> *mat_12;
  Matrix<double,_4,_4> *mat_13;
  Matrix<double,_4,_4> *mat_14;
  Matrix<double,_4,_3> *mat_15;
  Matrix<double,_3,_4> *mat_16;
  Matrix<double,_4,_2> *pMVar1;
  byte bVar2;
  long lStack_2e0;
  Matrix2d matrix_b;
  Matrix<double,_3,_2> matrix_b_transposed;
  Matrix<double,_4,_2> matrix_b_2;
  Matrix2d matrix_a;
  Matrix<double,_2,_2> result_1;
  Matrix2d result;
  
  bVar2 = 0;
  switch(*matrix_a_type) {
  case VARIABLE_TYPE_DMAT2:
    tcu::Matrix<double,_2,_2>::Matrix
              (&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_2>::Matrix
              (&matrix_b,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_2>::Matrix(&result);
    tcu::transpose<double,2,2>((Matrix<double,_2,_2> *)&matrix_b_transposed,(tcu *)&matrix_a,mat);
    tcu::Matrix<double,_2,_2>::operator=(&matrix_a,(Matrix<double,_2,_2> *)&matrix_b_transposed);
    tcu::transpose<double,2,2>((Matrix<double,_2,_2> *)&matrix_b_transposed,(tcu *)&matrix_b,mat_00)
    ;
    tcu::Matrix<double,_2,_2>::operator=(&matrix_b,(Matrix<double,_2,_2> *)&matrix_b_transposed);
    tcu::operator*((Matrix<double,_2,_2> *)&matrix_b_transposed,&matrix_a,&matrix_b);
    tcu::Matrix<double,_2,_2>::operator=(&result,(Matrix<double,_2,_2> *)&matrix_b_transposed);
    tcu::Matrix<double,_2,_2>::getColumnMajorData(&result);
    break;
  case VARIABLE_TYPE_DMAT2X3:
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)&result,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_2>::Matrix(&matrix_b_transposed);
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)&matrix_b_2,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_3>::Matrix((Matrix<double,_2,_3> *)&result_1);
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&matrix_a);
    tcu::transpose<double,2,3>((Matrix<double,_3,_2> *)&matrix_b,(tcu *)&result,mat_09);
    tcu::Matrix<double,_3,_2>::operator=(&matrix_b_transposed,(Matrix<double,_3,_2> *)&matrix_b);
    tcu::transpose<double,3,2>((Matrix<double,_2,_3> *)&matrix_b,(tcu *)&matrix_b_2,mat_10);
    tcu::Matrix<double,_2,_3>::operator=
              ((Matrix<double,_2,_3> *)&result_1,(Matrix<double,_2,_3> *)&matrix_b);
    tcu::operator*((Matrix<double,_3,_3> *)&matrix_b,&matrix_b_transposed,
                   (Matrix<double,_2,_3> *)&result_1);
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&matrix_a,(Matrix<double,_3,_3> *)&matrix_b);
    tcu::Matrix<double,_3,_3>::getColumnMajorData
              ((Array<double,_9> *)&matrix_b,(Matrix<double,_3,_3> *)&matrix_a);
    lStack_2e0 = 9;
    goto LAB_009f253e;
  case VARIABLE_TYPE_DMAT2X4:
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)&result,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_2>::Matrix((Matrix<double,_4,_2> *)&matrix_b_transposed);
    tcu::Matrix<double,_4,_2>::Matrix
              (&matrix_b_2,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_4>::Matrix((Matrix<double,_2,_4> *)&result_1);
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)&matrix_a);
    tcu::transpose<double,2,4>((Matrix<double,_4,_2> *)&matrix_b,(tcu *)&result,mat_03);
    tcu::Matrix<double,_4,_2>::operator=
              ((Matrix<double,_4,_2> *)&matrix_b_transposed,(Matrix<double,_4,_2> *)&matrix_b);
    tcu::transpose<double,4,2>((Matrix<double,_2,_4> *)&matrix_b,(tcu *)&matrix_b_2,mat_04);
    tcu::Matrix<double,_2,_4>::operator=
              ((Matrix<double,_2,_4> *)&result_1,(Matrix<double,_2,_4> *)&matrix_b);
    tcu::operator*((Matrix<double,_4,_4> *)&matrix_b,(Matrix<double,_4,_2> *)&matrix_b_transposed,
                   (Matrix<double,_2,_4> *)&result_1);
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)&matrix_a,(Matrix<double,_4,_4> *)&matrix_b);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)&matrix_b,(Matrix<double,_4,_4> *)&matrix_a);
    goto LAB_009f253c;
  case VARIABLE_TYPE_DMAT3:
    tcu::Matrix<double,_3,_3>::Matrix
              ((Matrix<double,_3,_3> *)&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_3>::Matrix
              ((Matrix<double,_3,_3> *)&matrix_b,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&result);
    tcu::transpose<double,3,3>((Matrix<double,_3,_3> *)&matrix_b_transposed,(tcu *)&matrix_a,mat_05)
    ;
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&matrix_a,(Matrix<double,_3,_3> *)&matrix_b_transposed);
    tcu::transpose<double,3,3>((Matrix<double,_3,_3> *)&matrix_b_transposed,(tcu *)&matrix_b,mat_06)
    ;
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&matrix_b,(Matrix<double,_3,_3> *)&matrix_b_transposed);
    tcu::operator*((Matrix<double,_3,_3> *)&matrix_b_transposed,(Matrix<double,_3,_3> *)&matrix_a,
                   (Matrix<double,_3,_3> *)&matrix_b);
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&result,(Matrix<double,_3,_3> *)&matrix_b_transposed);
    tcu::Matrix<double,_3,_3>::getColumnMajorData
              ((Array<double,_9> *)&matrix_b_transposed,(Matrix<double,_3,_3> *)&result);
    lStack_2e0 = 9;
    goto LAB_009f2607;
  case VARIABLE_TYPE_DMAT3X2:
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_3>::Matrix((Matrix<double,_2,_3> *)&matrix_b);
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)&result,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_2>::Matrix(&matrix_b_transposed);
    tcu::Matrix<double,_2,_2>::Matrix(&result_1);
    tcu::transpose<double,3,2>((Matrix<double,_2,_3> *)&matrix_b_2,(tcu *)&matrix_a,mat_01);
    tcu::Matrix<double,_2,_3>::operator=
              ((Matrix<double,_2,_3> *)&matrix_b,(Matrix<double,_2,_3> *)&matrix_b_2);
    tcu::transpose<double,2,3>((Matrix<double,_3,_2> *)&matrix_b_2,(tcu *)&result,mat_02);
    tcu::Matrix<double,_3,_2>::operator=(&matrix_b_transposed,(Matrix<double,_3,_2> *)&matrix_b_2);
    tcu::operator*((Matrix<double,_2,_2> *)&matrix_b_2,(Matrix<double,_2,_3> *)&matrix_b,
                   &matrix_b_transposed);
    tcu::Matrix<double,_2,_2>::operator=(&result_1,(Matrix<double,_2,_2> *)&matrix_b_2);
    tcu::Matrix<double,_2,_2>::getColumnMajorData(&result_1);
    matrix_b_transposed.m_data.m_data[0].m_data[0]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[0]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[0]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[0]._4_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[1]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[1]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[1]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[1]._4_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[2]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[2]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[2]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[2]._4_4_;
    matrix_b_transposed.m_data.m_data[1].m_data[0]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[3]._0_4_;
    matrix_b_transposed.m_data.m_data[1].m_data[0]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[3]._4_4_;
    break;
  case VARIABLE_TYPE_DMAT3X4:
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)&result,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_3>::Matrix((Matrix<double,_4,_3> *)&matrix_b_transposed);
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)&matrix_b_2,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_4>::Matrix((Matrix<double,_3,_4> *)&result_1);
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)&matrix_a);
    tcu::transpose<double,3,4>((Matrix<double,_4,_3> *)&matrix_b,(tcu *)&result,mat_11);
    tcu::Matrix<double,_4,_3>::operator=
              ((Matrix<double,_4,_3> *)&matrix_b_transposed,(Matrix<double,_4,_3> *)&matrix_b);
    tcu::transpose<double,4,3>((Matrix<double,_3,_4> *)&matrix_b,(tcu *)&matrix_b_2,mat_12);
    tcu::Matrix<double,_3,_4>::operator=
              ((Matrix<double,_3,_4> *)&result_1,(Matrix<double,_3,_4> *)&matrix_b);
    tcu::operator*((Matrix<double,_4,_4> *)&matrix_b,(Matrix<double,_4,_3> *)&matrix_b_transposed,
                   (Matrix<double,_3,_4> *)&result_1);
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)&matrix_a,(Matrix<double,_4,_4> *)&matrix_b);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)&matrix_b,(Matrix<double,_4,_4> *)&matrix_a);
LAB_009f253c:
    lStack_2e0 = 0x10;
LAB_009f253e:
    pMVar1 = (Matrix<double,_4,_2> *)&matrix_b;
code_r0x009f26fc:
    for (; lStack_2e0 != 0; lStack_2e0 = lStack_2e0 + -1) {
      *out_result_ptr = (pMVar1->m_data).m_data[0].m_data[0];
      pMVar1 = (Matrix<double,_4,_2> *)((long)pMVar1 + ((ulong)bVar2 * -2 + 1) * 8);
      out_result_ptr = out_result_ptr + (ulong)bVar2 * -2 + 1;
    }
    return;
  case VARIABLE_TYPE_DMAT4:
    tcu::Matrix<double,_4,_4>::Matrix
              ((Matrix<double,_4,_4> *)&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_4>::Matrix
              ((Matrix<double,_4,_4> *)&matrix_b,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)&result);
    tcu::transpose<double,4,4>((Matrix<double,_4,_4> *)&matrix_b_transposed,(tcu *)&matrix_a,mat_13)
    ;
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)&matrix_a,(Matrix<double,_4,_4> *)&matrix_b_transposed);
    tcu::transpose<double,4,4>((Matrix<double,_4,_4> *)&matrix_b_transposed,(tcu *)&matrix_b,mat_14)
    ;
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)&matrix_b,(Matrix<double,_4,_4> *)&matrix_b_transposed);
    tcu::operator*((Matrix<double,_4,_4> *)&matrix_b_transposed,(Matrix<double,_4,_4> *)&matrix_a,
                   (Matrix<double,_4,_4> *)&matrix_b);
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)&result,(Matrix<double,_4,_4> *)&matrix_b_transposed);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)&matrix_b_transposed,(Matrix<double,_4,_4> *)&result);
    lStack_2e0 = 0x10;
LAB_009f2607:
    pMVar1 = (Matrix<double,_4,_2> *)&matrix_b_transposed;
    goto code_r0x009f26fc;
  case VARIABLE_TYPE_DMAT4X2:
    tcu::Matrix<double,_4,_2>::Matrix
              ((Matrix<double,_4,_2> *)&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_2,_4>::Matrix((Matrix<double,_2,_4> *)&matrix_b);
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)&result,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_2>::Matrix((Matrix<double,_4,_2> *)&matrix_b_transposed);
    tcu::Matrix<double,_2,_2>::Matrix(&result_1);
    tcu::transpose<double,4,2>((Matrix<double,_2,_4> *)&matrix_b_2,(tcu *)&matrix_a,mat_07);
    tcu::Matrix<double,_2,_4>::operator=
              ((Matrix<double,_2,_4> *)&matrix_b,(Matrix<double,_2,_4> *)&matrix_b_2);
    tcu::transpose<double,2,4>(&matrix_b_2,(tcu *)&result,mat_08);
    tcu::Matrix<double,_4,_2>::operator=((Matrix<double,_4,_2> *)&matrix_b_transposed,&matrix_b_2);
    tcu::operator*((Matrix<double,_2,_2> *)&matrix_b_2,(Matrix<double,_2,_4> *)&matrix_b,
                   (Matrix<double,_4,_2> *)&matrix_b_transposed);
    tcu::Matrix<double,_2,_2>::operator=(&result_1,(Matrix<double,_2,_2> *)&matrix_b_2);
    tcu::Matrix<double,_2,_2>::getColumnMajorData(&result_1);
    matrix_b_transposed.m_data.m_data[0].m_data[0]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[0]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[0]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[0]._4_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[1]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[1]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[1]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[1]._4_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[2]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[2]._0_4_;
    matrix_b_transposed.m_data.m_data[0].m_data[2]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[2]._4_4_;
    matrix_b_transposed.m_data.m_data[1].m_data[0]._0_4_ =
         matrix_b_2.m_data.m_data[0].m_data[3]._0_4_;
    matrix_b_transposed.m_data.m_data[1].m_data[0]._4_4_ =
         matrix_b_2.m_data.m_data[0].m_data[3]._4_4_;
    break;
  case VARIABLE_TYPE_DMAT4X3:
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)&matrix_a,
               (matrix_a_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_3,_4>::Matrix((Matrix<double,_3,_4> *)&matrix_b);
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)&result,
               (matrix_b_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    tcu::Matrix<double,_4,_3>::Matrix((Matrix<double,_4,_3> *)&matrix_b_transposed);
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&result_1);
    tcu::transpose<double,4,3>((Matrix<double,_3,_4> *)&matrix_b_2,(tcu *)&matrix_a,mat_15);
    tcu::Matrix<double,_3,_4>::operator=
              ((Matrix<double,_3,_4> *)&matrix_b,(Matrix<double,_3,_4> *)&matrix_b_2);
    tcu::transpose<double,3,4>((Matrix<double,_4,_3> *)&matrix_b_2,(tcu *)&result,mat_16);
    tcu::Matrix<double,_4,_3>::operator=
              ((Matrix<double,_4,_3> *)&matrix_b_transposed,(Matrix<double,_4,_3> *)&matrix_b_2);
    tcu::operator*((Matrix<double,_3,_3> *)&matrix_b_2,(Matrix<double,_3,_4> *)&matrix_b,
                   (Matrix<double,_4,_3> *)&matrix_b_transposed);
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)&result_1,(Matrix<double,_3,_3> *)&matrix_b_2);
    tcu::Matrix<double,_3,_3>::getColumnMajorData
              ((Array<double,_9> *)&matrix_b_2,(Matrix<double,_3,_3> *)&result_1);
    lStack_2e0 = 9;
    pMVar1 = &matrix_b_2;
    goto code_r0x009f26fc;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized matrix A type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c2e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(undefined4 *)(out_result_ptr + 2) = matrix_b_transposed.m_data.m_data[0].m_data[2]._0_4_;
  *(undefined4 *)((long)out_result_ptr + 0x14) =
       matrix_b_transposed.m_data.m_data[0].m_data[2]._4_4_;
  *(undefined4 *)(out_result_ptr + 3) = matrix_b_transposed.m_data.m_data[1].m_data[0]._0_4_;
  *(undefined4 *)((long)out_result_ptr + 0x1c) =
       matrix_b_transposed.m_data.m_data[1].m_data[0]._4_4_;
  *(undefined4 *)out_result_ptr = matrix_b_transposed.m_data.m_data[0].m_data[0]._0_4_;
  *(undefined4 *)((long)out_result_ptr + 4) = matrix_b_transposed.m_data.m_data[0].m_data[0]._4_4_;
  *(undefined4 *)(out_result_ptr + 1) = matrix_b_transposed.m_data.m_data[0].m_data[1]._0_4_;
  *(undefined4 *)((long)out_result_ptr + 0xc) = matrix_b_transposed.m_data.m_data[0].m_data[1]._4_4_
  ;
  return;
}

Assistant:

void GPUShaderFP64Test9::getMatrixMultiplicationResult(const Utils::_variable_type& matrix_a_type,
													   const std::vector<double>&   matrix_a_data,
													   const Utils::_variable_type& matrix_b_type,
													   const std::vector<double>& matrix_b_data, double* out_result_ptr)
{
	(void)matrix_b_type;
	using namespace tcu;
	/* To keep the code maintainable, we only consider cases relevant for this test */
	switch (matrix_a_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2);

		tcu::Matrix2d matrix_a(&matrix_a_data[0]);
		tcu::Matrix2d matrix_b(&matrix_b_data[0]);
		tcu::Matrix2d result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X2);

		tcu::Matrix<double, 2, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 2> matrix_a_transposed;
		tcu::Matrix<double, 3, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X2);

		tcu::Matrix<double, 2, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 2> matrix_a_transposed;
		tcu::Matrix<double, 4, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3);

		tcu::Matrix<double, 3, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 3> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X3);

		tcu::Matrix<double, 3, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 3> matrix_a_transposed;
		tcu::Matrix<double, 2, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X3);

		tcu::Matrix<double, 3, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 3> matrix_a_transposed;
		tcu::Matrix<double, 4, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4);

		tcu::Matrix<double, 4, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 4> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X4);

		tcu::Matrix<double, 4, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 4> matrix_a_transposed;
		tcu::Matrix<double, 2, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X4);

		tcu::Matrix<double, 4, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 4> matrix_a_transposed;
		tcu::Matrix<double, 3, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized matrix A type");
	}
	} /* switch (matrix_a_type) */
}